

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int on_data_chunk_recv(nghttp2_session *session,uint8_t flags,int32_t stream_id,uint8_t *mem,
                      size_t len,void *userp)

{
  RTSP *pRVar1;
  Curl_easy *data;
  Curl_easy *pCVar2;
  size_t local_68;
  http_conn *httpc;
  connectdata *conn;
  size_t nread;
  Curl_easy *data_s;
  HTTP *stream;
  void *userp_local;
  size_t len_local;
  uint8_t *mem_local;
  int32_t stream_id_local;
  uint8_t flags_local;
  nghttp2_session *session_local;
  
  data = (Curl_easy *)nghttp2_session_get_stream_user_data(session,stream_id);
  if (data == (Curl_easy *)0x0) {
    session_local._4_4_ = 0;
  }
  else {
    pRVar1 = (data->req).p.rtsp;
    if (pRVar1 == (RTSP *)0x0) {
      session_local._4_4_ = -0x386;
    }
    else {
      local_68 = len;
      if ((pRVar1->http_wrapper).len < len) {
        local_68 = (pRVar1->http_wrapper).len;
      }
      memcpy((pRVar1->http_wrapper).mem + (pRVar1->http_wrapper).memlen,mem,local_68);
      (pRVar1->http_wrapper).len = (pRVar1->http_wrapper).len - local_68;
      (pRVar1->http_wrapper).memlen = local_68 + (pRVar1->http_wrapper).memlen;
      drain_this(data,(http_conn *)((long)userp + 0x448));
      pCVar2 = get_transfer((http_conn *)((long)userp + 0x448));
      if (pCVar2 != data) {
        Curl_expire(data,0,EXPIRE_RUN_NOW);
      }
      if (local_68 < len) {
        (pRVar1->http_wrapper).pausedata = mem + local_68;
        (pRVar1->http_wrapper).pauselen = len - local_68;
        (data->conn->proto).httpc.pause_stream_id = stream_id;
        session_local._4_4_ = -0x20e;
      }
      else {
        pCVar2 = get_transfer((http_conn *)((long)userp + 0x448));
        if (pCVar2 == data) {
          session_local._4_4_ = 0;
        }
        else {
          (data->conn->proto).httpc.pause_stream_id = stream_id;
          session_local._4_4_ = -0x20e;
        }
      }
    }
  }
  return session_local._4_4_;
}

Assistant:

static int on_data_chunk_recv(nghttp2_session *session, uint8_t flags,
                              int32_t stream_id,
                              const uint8_t *mem, size_t len, void *userp)
{
  struct HTTP *stream;
  struct Curl_easy *data_s;
  size_t nread;
  struct connectdata *conn = (struct connectdata *)userp;
  struct http_conn *httpc = &conn->proto.httpc;
  (void)session;
  (void)flags;

  DEBUGASSERT(stream_id); /* should never be a zero stream ID here */

  /* get the stream from the hash based on Stream ID */
  data_s = nghttp2_session_get_stream_user_data(session, stream_id);
  if(!data_s) {
    /* Receiving a Stream ID not in the hash should not happen - unless
       we have aborted a transfer artificially and there were more data
       in the pipeline. Silently ignore. */
    H2BUGF(fprintf(stderr, "Data for stream %u but it doesn't exist\n",
                   stream_id));
    return 0;
  }

  stream = data_s->req.p.http;
  if(!stream)
    return NGHTTP2_ERR_CALLBACK_FAILURE;

  nread = CURLMIN(stream->len, len);
  memcpy(&stream->mem[stream->memlen], mem, nread);

  stream->len -= nread;
  stream->memlen += nread;

  drain_this(data_s, &conn->proto.httpc);

  /* if we receive data for another handle, wake that up */
  if(get_transfer(httpc) != data_s)
    Curl_expire(data_s, 0, EXPIRE_RUN_NOW);

  H2BUGF(infof(data_s, "%zu data received for stream %u "
               "(%zu left in buffer %p, total %zu)",
               nread, stream_id,
               stream->len, stream->mem,
               stream->memlen));

  if(nread < len) {
    stream->pausedata = mem + nread;
    stream->pauselen = len - nread;
    H2BUGF(infof(data_s, "NGHTTP2_ERR_PAUSE - %zu bytes out of buffer"
                 ", stream %u",
                 len - nread, stream_id));
    data_s->conn->proto.httpc.pause_stream_id = stream_id;

    return NGHTTP2_ERR_PAUSE;
  }

  /* pause execution of nghttp2 if we received data for another handle
     in order to process them first. */
  if(get_transfer(httpc) != data_s) {
    data_s->conn->proto.httpc.pause_stream_id = stream_id;

    return NGHTTP2_ERR_PAUSE;
  }

  return 0;
}